

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_traversal.c
# Opt level: O1

void get_pointer(t_get *x,t_gpointer *gp)

{
  char cVar1;
  t_gstub *ptVar2;
  _scalar *p_Var3;
  t_getvariable *ptVar4;
  int iVar5;
  t_symbol *s;
  t_symbol *ptVar6;
  t_template *x_00;
  char *pcVar7;
  char *pcVar8;
  int iVar9;
  char *fmt;
  long lVar10;
  t_getvariable *ptVar11;
  bool bVar12;
  int onset;
  int type;
  t_symbol *arraytype;
  int local_40;
  int local_3c;
  t_symbol *local_38;
  
  iVar9 = x->x_nout;
  ptVar2 = gp->gp_stub;
  iVar5 = gpointer_check(gp,0);
  if (iVar5 == 0) {
    pd_error(x,"get: stale or empty pointer");
    return;
  }
  ptVar6 = x->x_templatesym;
  cVar1 = *ptVar6->s_name;
  s = gpointer_gettemplatesym(gp);
  if ((cVar1 != '\0') && (bVar12 = ptVar6 != s, s = ptVar6, bVar12)) {
    pcVar8 = ptVar6->s_name;
    ptVar6 = gpointer_gettemplatesym(gp);
    pd_error(x,"get %s: got wrong template (%s)",pcVar8,ptVar6->s_name);
    return;
  }
  x_00 = template_findbyname(s);
  if (x_00 == (t_template *)0x0) {
    pd_error(x,"get: couldn\'t find template %s",s->s_name);
    return;
  }
  lVar10 = 0x18;
  if (ptVar2->gs_which == 2) {
    lVar10 = 0;
  }
  if (0 < iVar9) {
    p_Var3 = (gp->gp_un).gp_scalar;
    ptVar4 = x->x_variables + iVar9;
    do {
      ptVar11 = ptVar4 + -1;
      iVar5 = template_find_field(x_00,ptVar11->gv_sym,&local_40,&local_3c,&local_38);
      if (iVar5 == 0) {
        pcVar8 = x_00->t_sym->s_name;
        pcVar7 = ptVar11->gv_sym->s_name;
        fmt = "get: %s.%s: no such field";
LAB_00164e39:
        pd_error(x,fmt,pcVar8,pcVar7);
      }
      else if (local_3c == 1) {
        outlet_symbol(ptVar4[-1].gv_outlet,
                      *(t_symbol **)((long)p_Var3->sc_vec + local_40 + lVar10 + -0x18));
      }
      else {
        if (local_3c != 0) {
          pcVar8 = x_00->t_sym->s_name;
          pcVar7 = ptVar11->gv_sym->s_name;
          fmt = "get: %s.%s is not a number or symbol";
          goto LAB_00164e39;
        }
        outlet_float(ptVar4[-1].gv_outlet,
                     *(t_float *)((long)p_Var3->sc_vec + local_40 + lVar10 + -0x18));
      }
      iVar5 = iVar9 + -1;
      bVar12 = 0 < iVar9;
      iVar9 = iVar5;
      ptVar4 = ptVar11;
    } while (iVar5 != 0 && bVar12);
  }
  return;
}

Assistant:

static void get_pointer(t_get *x, t_gpointer *gp)
{
    int nitems = x->x_nout, i;
    t_symbol *templatesym;
    t_template *template;
    t_gstub *gs = gp->gp_stub;
    t_word *vec;
    t_getvariable *vp;

    if (!gpointer_check(gp, 0))
    {
        pd_error(x, "get: stale or empty pointer");
        return;
    }
    if (*x->x_templatesym->s_name)
    {
        if ((templatesym = x->x_templatesym) != gpointer_gettemplatesym(gp))
        {
            pd_error(x, "get %s: got wrong template (%s)",
                templatesym->s_name, gpointer_gettemplatesym(gp)->s_name);
            return;
        }
    }
    else templatesym = gpointer_gettemplatesym(gp);
    if (!(template = template_findbyname(templatesym)))
    {
        pd_error(x, "get: couldn't find template %s", templatesym->s_name);
        return;
    }
    if (gs->gs_which == GP_ARRAY) vec = gp->gp_un.gp_w;
    else vec = gp->gp_un.gp_scalar->sc_vec;
    for (i = nitems - 1, vp = x->x_variables + i; i >= 0; i--, vp--)
    {
        int onset, type;
        t_symbol *arraytype;
        if (template_find_field(template, vp->gv_sym, &onset, &type, &arraytype))
        {
            if (type == DT_FLOAT)
                outlet_float(vp->gv_outlet,
                    *(t_float *)(((char *)vec) + onset));
            else if (type == DT_SYMBOL)
                outlet_symbol(vp->gv_outlet,
                    *(t_symbol **)(((char *)vec) + onset));
            else pd_error(x, "get: %s.%s is not a number or symbol",
                    template->t_sym->s_name, vp->gv_sym->s_name);
        }
        else pd_error(x, "get: %s.%s: no such field",
            template->t_sym->s_name, vp->gv_sym->s_name);
    }
}